

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

vector<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_> * __thiscall
wallet::anon_unknown_5::WalletImpl::getCoins
          (WalletImpl *this,vector<COutPoint,_std::allocator<COutPoint>_> *outputs)

{
  long lVar1;
  bool bVar2;
  int n;
  CWalletTx *wtx;
  element_type *peVar3;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> wtx_00;
  CWallet *in_RDX;
  vector<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_> *in_RSI;
  AnnotatedMixin<std::recursive_mutex> *in_RDI;
  long in_FS_OFFSET;
  int depth;
  COutPoint *output;
  vector<COutPoint,_std::allocator<COutPoint>_> *__range2;
  vector<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_> *result;
  iterator it;
  const_iterator __end2;
  const_iterator __begin2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock30;
  WalletTxOut *in_stack_fffffffffffffef8;
  element_type *in_stack_ffffffffffffff00;
  element_type *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  CWallet *this_00;
  char *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _GLOBAL__N_1::std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffef8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffef8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_RSI,in_RDI,
             in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff18 >> 0x18,0));
  _GLOBAL__N_1::std::vector<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_>::
  vector((vector<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_> *)
         in_stack_fffffffffffffef8);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::size
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_fffffffffffffef8);
  _GLOBAL__N_1::std::vector<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_>::
  reserve(in_RSI,(size_type)in_RDI);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::begin
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffff00);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::end
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffff00);
  while (bVar2 = __gnu_cxx::
                 operator==<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                           ((__normal_iterator<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                             *)in_stack_ffffffffffffff08,
                            (__normal_iterator<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                             *)in_stack_ffffffffffffff00), ((bVar2 ^ 0xffU) & 1) != 0) {
    wtx = (CWalletTx *)
          __gnu_cxx::
          __normal_iterator<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
          ::operator*((__normal_iterator<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                       *)in_stack_fffffffffffffef8);
    _GLOBAL__N_1::std::vector<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_>::
    emplace_back<>((vector<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_> *)
                   in_stack_ffffffffffffff08);
    peVar3 = _GLOBAL__N_1::std::
             __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)in_stack_fffffffffffffef8);
    this_00 = (CWallet *)&peVar3->mapWallet;
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_fffffffffffffef8);
    wtx_00._M_cur =
         (__node_type *)
         _GLOBAL__N_1::std::
         unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
         ::find((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
                 *)in_stack_ffffffffffffff00,(key_type *)in_stack_fffffffffffffef8);
    _GLOBAL__N_1::std::
    __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffef8);
    _GLOBAL__N_1::std::
    unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
    ::end((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
           *)in_stack_ffffffffffffff00);
    bVar2 = _GLOBAL__N_1::std::__detail::operator==
                      ((_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                       in_stack_ffffffffffffff08,
                       (_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                       in_stack_ffffffffffffff00);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      in_stack_ffffffffffffff08 =
           _GLOBAL__N_1::std::
           __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_stack_fffffffffffffef8);
      _GLOBAL__N_1::std::__detail::
      _Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::operator->
                ((_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
                 in_stack_fffffffffffffef8);
      n = CWallet::GetTxDepthInMainChain(this_00,(CWalletTx *)wtx_00._M_cur);
      if (-1 < n) {
        in_stack_ffffffffffffff00 =
             _GLOBAL__N_1::std::
             __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_ffffffffffffff08);
        _GLOBAL__N_1::std::__detail::
        _Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::operator->
                  ((_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
                   in_stack_fffffffffffffef8);
        MakeWalletTxOut(in_RDX,wtx,n,in_stack_ffffffffffffff48);
        _GLOBAL__N_1::std::vector<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_>
        ::back((vector<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_> *)
               in_stack_fffffffffffffef8);
        interfaces::WalletTxOut::operator=
                  ((WalletTxOut *)in_stack_ffffffffffffff08,(WalletTxOut *)in_stack_ffffffffffffff00
                  );
        interfaces::WalletTxOut::~WalletTxOut(in_stack_fffffffffffffef8);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>::
    operator++((__normal_iterator<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                *)in_stack_fffffffffffffef8);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffef8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (vector<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<WalletTxOut> getCoins(const std::vector<COutPoint>& outputs) override
    {
        LOCK(m_wallet->cs_wallet);
        std::vector<WalletTxOut> result;
        result.reserve(outputs.size());
        for (const auto& output : outputs) {
            result.emplace_back();
            auto it = m_wallet->mapWallet.find(output.hash);
            if (it != m_wallet->mapWallet.end()) {
                int depth = m_wallet->GetTxDepthInMainChain(it->second);
                if (depth >= 0) {
                    result.back() = MakeWalletTxOut(*m_wallet, it->second, output.n, depth);
                }
            }
        }
        return result;
    }